

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool anon_unknown.dwarf_107107::IsLoadAliasedWithStore
               (VmInstruction *loadInst,VmInstruction *storeInst)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmValue **ppVVar3;
  VmValue *pVVar4;
  VmValue *pVVar5;
  TypeBase *pTVar6;
  bool bVar7;
  VmValue *pVVar8;
  VmValue *pVVar9;
  
  uVar1 = (loadInst->arguments).count;
  if ((uVar1 == 0) || (uVar1 == 1)) {
LAB_001a16bd:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
  ppVVar2 = (loadInst->arguments).data;
  pVVar9 = ppVVar2[1];
  if ((pVVar9 == (VmValue *)0x0) || (pVVar9->typeID != 1)) {
    pVVar9 = (VmValue *)0x0;
  }
  uVar1 = (storeInst->arguments).count;
  if ((uVar1 == 0) || (uVar1 == 1)) goto LAB_001a16bd;
  ppVVar3 = (storeInst->arguments).data;
  pVVar8 = ppVVar3[1];
  if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 1)) {
    pVVar8 = (VmValue *)0x0;
  }
  pVVar4 = *ppVVar2;
  pVVar5 = *ppVVar3;
  switch(loadInst->cmd) {
  case VM_INST_LOAD_BYTE:
    if (storeInst->cmd != VM_INST_STORE_BYTE) break;
    goto LAB_001a1670;
  case VM_INST_LOAD_SHORT:
    if (storeInst->cmd == VM_INST_STORE_SHORT) goto LAB_001a1670;
    break;
  case VM_INST_LOAD_INT:
    if (storeInst->cmd == VM_INST_STORE_INT) goto LAB_001a1670;
    break;
  case VM_INST_LOAD_FLOAT:
    if (storeInst->cmd == VM_INST_STORE_FLOAT) goto LAB_001a1670;
    break;
  case VM_INST_LOAD_DOUBLE:
    if (storeInst->cmd == VM_INST_STORE_DOUBLE) goto LAB_001a1670;
    break;
  case VM_INST_LOAD_LONG:
    if (storeInst->cmd == VM_INST_STORE_LONG) goto LAB_001a1670;
  }
  bVar7 = IsBuiltInStructLoadStore(loadInst);
  if ((bVar7) && (bVar7 = IsBuiltInStructLoadStore(storeInst), bVar7)) {
LAB_001a1670:
    pTVar6 = (pVVar4->type).structType;
    if (((pTVar6 == (TypeBase *)0x0) || (pTVar6 != (pVVar5->type).structType)) ||
       (*(int *)&pVVar9[1]._vptr_VmValue == *(int *)&pVVar8[1]._vptr_VmValue)) {
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
  }
  else {
    bVar7 = true;
    if (loadInst->cmd != VM_INST_LOAD_STRUCT) {
      bVar7 = storeInst->cmd == VM_INST_STORE_STRUCT;
    }
  }
  return bVar7;
}

Assistant:

VmInstructionType GetStoreInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_STORE_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_STORE_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_STORE_INT;

		if(type == ctx.typeFloat)
			return VM_INST_STORE_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_STORE_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_STORE_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_STORE_POINTER;

		if(isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeFunction>(type) || isType<TypeUnsizedArray>(type) || type == ctx.typeAutoRef || type == ctx.typeAutoArray)
			return VM_INST_STORE_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_STORE_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_STORE_STRUCT;
	}